

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall
bloaty::RangeSink::AddRange
          (RangeSink *this,char *analyzer,string_view name,uint64_t vmaddr,uint64_t vmsize,
          uint64_t fileoff,uint64_t filesize)

{
  pointer ppVar1;
  bool bVar2;
  char *pcVar3;
  Arg *a4;
  pointer ppVar4;
  uint64_t size;
  string_view name_00;
  string_view format;
  string label;
  Arg local_110;
  string local_e0;
  Arg local_c0;
  Arg local_90;
  Arg local_60;
  
  a4 = (Arg *)name._M_str;
  name_00._M_len = name._M_len;
  if ((vmsize == 0xffffffffffffffff) || (filesize == 0xffffffffffffffff)) {
    Throw("AddRange() does not allow unknown size.",0x52c);
  }
  bVar2 = IsVerboseForVMRange(this,vmaddr,vmsize);
  if (bVar2) {
LAB_0016c644:
    pcVar3 = GetDataSourceLabel(this->data_source_);
    printf("[%s, %s] AddRange(%.*s, %lx, %lx, %lx, %lx)\n",pcVar3,analyzer,name_00._M_len,a4,vmaddr,
           vmsize,fileoff,filesize);
  }
  else {
    bVar2 = IsVerboseForFileRange(this,fileoff,filesize);
    if (bVar2) goto LAB_0016c644;
  }
  if (this->translator_ == (DualMap *)0x0) {
LAB_0016c6bb:
    ppVar4 = (this->outputs_).
             super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (this->outputs_).
             super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    size = vmsize;
    if (filesize < vmsize) {
      size = filesize;
    }
    for (; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1) {
      name_00._M_str = (char *)a4;
      NameMunger::Munge_abi_cxx11_(&label,ppVar4->second,name_00);
      RangeMap::AddDualRange(&ppVar4->first->vm_map,vmaddr,size,fileoff,&label);
      RangeMap::AddDualRange(&ppVar4->first->file_map,fileoff,size,vmaddr,&label);
      RangeMap::AddRange(&ppVar4->first->vm_map,size + vmaddr,vmsize - size,&label);
      RangeMap::AddRange(&ppVar4->first->file_map,size + fileoff,filesize - size,&label);
      std::__cxx11::string::~string((string *)&label);
    }
  }
  else {
    bVar2 = RangeMap::CoversRange(&this->translator_->vm_map,vmaddr,vmsize);
    if (bVar2) {
      bVar2 = RangeMap::CoversRange(&this->translator_->file_map,fileoff,filesize);
      if (bVar2) goto LAB_0016c6bb;
    }
    if (0 < verbose_level) {
      label._0_16_ = absl::NullSafeStringView((Nullable<const_char_*>)a4);
      absl::substitute_internal::Arg::Arg(&local_110,vmaddr);
      absl::substitute_internal::Arg::Arg(&local_60,vmsize);
      absl::substitute_internal::Arg::Arg(&local_90,fileoff);
      absl::substitute_internal::Arg::Arg(&local_c0,filesize);
      format._M_str = (char *)&label;
      format._M_len =
           (size_t)
           "AddRange($0, $1, $2, $3, $4) will be ignored, because it is not covered by base map.";
      absl::Substitute_abi_cxx11_
                (&local_e0,(absl *)0x54,format,&local_110,&local_60,&local_90,&local_c0,a4);
      printf("WARNING: %s\n",local_e0._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_e0);
    }
  }
  return;
}

Assistant:

void RangeSink::AddRange(const char* analyzer, string_view name,
                         uint64_t vmaddr, uint64_t vmsize, uint64_t fileoff,
                         uint64_t filesize) {
  if (vmsize == RangeMap::kUnknownSize || filesize == RangeMap::kUnknownSize) {
    // AddRange() is used for segments and sections; the mappings that establish
    // the file <-> vm mapping.  The size should always be known.  Moreover it
    // would be unclear how the logic should work if the size was *not* known.
    THROW("AddRange() does not allow unknown size.");
  }

  if (IsVerboseForVMRange(vmaddr, vmsize) ||
      IsVerboseForFileRange(fileoff, filesize)) {
    printf("[%s, %s] AddRange(%.*s, %" PRIx64 ", %" PRIx64 ", %" PRIx64
           ", %" PRIx64 ")\n",
           GetDataSourceLabel(data_source_), analyzer, (int)name.size(),
           name.data(), vmaddr, vmsize, fileoff, filesize);
  }

  if (translator_) {
    if (!translator_->vm_map.CoversRange(vmaddr, vmsize) ||
        !translator_->file_map.CoversRange(fileoff, filesize)) {
      WARN("AddRange($0, $1, $2, $3, $4) will be ignored, because it is not "
           "covered by base map.",
           name.data(), vmaddr, vmsize, fileoff, filesize);
      return;
    }
  }

  for (auto& pair : outputs_) {
    const std::string label = pair.second->Munge(name);
    uint64_t common = std::min(vmsize, filesize);

    pair.first->vm_map.AddDualRange(vmaddr, common, fileoff, label);
    pair.first->file_map.AddDualRange(fileoff, common, vmaddr, label);

    pair.first->vm_map.AddRange(vmaddr + common, vmsize - common, label);
    pair.first->file_map.AddRange(fileoff + common, filesize - common, label);
  }
}